

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entries.hpp
# Opt level: O2

size_t binlog::serializeSizePrefixedTagged<binlog::WriterProp,binlog::detail::VectorOutputStream>
                 (WriterProp *entry,VectorOutputStream *out)

{
  size_t sVar1;
  uint t;
  
  sVar1 = mserialize::
          StructSerializer<binlog::WriterProp,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::id>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::WriterProp::*,_&binlog::WriterProp::name>,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::batchSize>_>
          ::serialized_size(entry);
  t = (int)sVar1 + 8;
  mserialize::detail::TrivialSerializer<unsigned_int>::serialize<binlog::detail::VectorOutputStream>
            (t,out);
  mserialize::detail::TrivialSerializer<unsigned_long>::
  serialize<binlog::detail::VectorOutputStream>(0xfffffffffffffffe,out);
  mserialize::
  StructSerializer<binlog::WriterProp,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::id>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::WriterProp::*,_&binlog::WriterProp::name>,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::batchSize>_>
  ::serialize<binlog::detail::VectorOutputStream>(entry,out);
  return (ulong)t + 4;
}

Assistant:

std::size_t serializeSizePrefixedTagged(const Entry& entry, OutputStream& out)
{
  const std::uint64_t tag = Entry::Tag;
  const std::uint32_t size = std::uint32_t(mserialize::serialized_size(entry) + sizeof(tag));
  mserialize::serialize(size, out);
  mserialize::serialize(tag, out);
  mserialize::serialize(entry, out);

  return size + sizeof(size);
}